

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O2

uint32_t NewtDeeplyLength(newtRefArg r)

{
  uint16_t uVar1;
  uint32_t uVar2;
  
  uVar1 = NewtGetRefType(r,true);
  if (uVar1 == 0xb) {
    uVar2 = NewtDeeplyFrameLength(r);
    return uVar2;
  }
  uVar2 = NewtLength(r);
  return uVar2;
}

Assistant:

uint32_t NewtDeeplyLength(newtRefArg r)
{
    uint32_t	len = 0;
    
    switch (NewtGetRefType(r, true))
    {
        case kNewtFrame:
            len = NewtDeeplyFrameLength(r);
            break;
            
        default:
            len = NewtLength(r);
            break;
    }
    
    return len;
}